

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::invertOrientation(SurfaceMesh *this,Face f)

{
  char cVar1;
  bool bVar2;
  runtime_error *this_00;
  size_t sVar3;
  size_t sVar4;
  reference pvVar5;
  reference pvVar6;
  byte *pbVar7;
  SurfaceMesh *in_RDI;
  Halfedge he_1;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __end2_1;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __begin2_1;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *__range2_1;
  Vertex nextVert;
  Halfedge nextHe;
  Halfedge prevHe;
  Vertex firstVert;
  Halfedge currHe;
  Halfedge firstHe;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __end2;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __begin2;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *__range2;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffdf8;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffe00;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *this_01;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffe10;
  SurfaceMesh *in_stack_fffffffffffffe90;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
  in_stack_fffffffffffffe98;
  SurfaceMesh *in_stack_fffffffffffffec0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
  in_stack_fffffffffffffec8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_108;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_f8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_e8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_d8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_c8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_b8;
  ParentMeshT *local_a8;
  size_t local_a0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_98;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_88 [2];
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_58;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *local_30;
  
  bVar2 = usesImplicitTwin(in_RDI);
  if (bVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,"Cannot invert orientation on oriented surface. Try a general SurfaceMesh.");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  Face::adjacentHalfedges((Face *)in_stack_fffffffffffffe10);
  local_30 = &local_58;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::begin
            (in_stack_fffffffffffffe10);
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::end(local_88,local_30)
  ;
  while (bVar2 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
                 operator!=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8), bVar2) {
    local_98 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
               operator*((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                          *)0x2363ac);
    local_a8 = local_98.mesh;
    local_a0 = local_98.ind;
    removeFromVertexLists(in_stack_fffffffffffffe90,(Halfedge)in_stack_fffffffffffffe98);
    NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::operator++
              (in_stack_fffffffffffffe00);
  }
  local_b8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
             Face::halfedge((Face *)in_stack_fffffffffffffe00);
  local_c8.mesh = local_b8.mesh;
  local_c8.ind = local_b8.ind;
  local_d8 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe00);
  Halfedge::Halfedge((Halfedge *)0x23646f);
  do {
    local_f8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::next((Halfedge *)in_stack_fffffffffffffe00);
    bVar2 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator==(&local_f8,&local_b8);
    if (bVar2) {
      local_108 = local_d8;
    }
    else {
      local_108 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe00);
    }
    sVar3 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_108);
    sVar4 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_c8);
    pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->heVertexArr,sVar4);
    *pvVar5 = sVar3;
    sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_c8);
    sVar4 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_108);
    pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->vHalfedgeArr,sVar4);
    *pvVar5 = sVar3;
    sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_c8);
    pvVar6 = ::std::vector<char,_std::allocator<char>_>::operator[](&in_RDI->heOrientArr,sVar3);
    cVar1 = *pvVar6;
    sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_c8);
    pbVar7 = (byte *)::std::vector<char,_std::allocator<char>_>::operator[]
                               (&in_RDI->heOrientArr,sVar3);
    *pbVar7 = (cVar1 != '\0' ^ 0xffU) & 1;
    Halfedge::Halfedge((Halfedge *)0x2365f1);
    bVar2 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator!=((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        *)in_stack_fffffffffffffe00,
                       (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        *)in_stack_fffffffffffffdf8);
    if (bVar2) {
      sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
              getIndex(&local_e8);
      in_stack_fffffffffffffe10 =
           (NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
           &in_RDI->heNextArr;
      sVar4 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
              getIndex(&local_c8);
      pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe10,sVar4);
      *pvVar5 = sVar3;
    }
    local_e8.mesh = local_c8.mesh;
    local_e8.ind = local_c8.ind;
    local_c8.mesh = local_f8.mesh;
    local_c8.ind = local_f8.ind;
    bVar2 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator!=((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        *)in_stack_fffffffffffffe00,
                       (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        *)in_stack_fffffffffffffdf8);
  } while (bVar2);
  sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
          getIndex(&local_e8);
  this_01 = (NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
            &in_RDI->heNextArr;
  sVar4 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
          getIndex(&local_b8);
  pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,sVar4);
  *pvVar5 = sVar3;
  Face::adjacentHalfedges((Face *)in_stack_fffffffffffffe10);
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::begin
            (in_stack_fffffffffffffe10);
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::end
            ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
             &stack0xfffffffffffffe88,
             (NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
             &stack0xfffffffffffffeb8);
  while (bVar2 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
                 operator!=(this_01,in_stack_fffffffffffffdf8), bVar2) {
    NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::operator*
              ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
               0x23676e);
    addToVertexLists(in_stack_fffffffffffffec0,(Halfedge)in_stack_fffffffffffffec8);
    NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::operator++
              (this_01);
  }
  in_RDI->modificationTick = in_RDI->modificationTick + 1;
  return;
}

Assistant:

void SurfaceMesh::invertOrientation(Face f) {
  if (usesImplicitTwin())
    throw std::runtime_error("Cannot invert orientation on oriented surface. Try a general SurfaceMesh.");

  for (Halfedge he : f.adjacentHalfedges()) removeFromVertexLists(he);

  Halfedge firstHe = f.halfedge();
  Halfedge currHe = firstHe;
  Vertex firstVert = currHe.vertex();
  Halfedge prevHe = Halfedge();
  do {
    // gather values
    Halfedge nextHe = currHe.next();
    Vertex nextVert = (nextHe == firstHe) ? firstVert : nextHe.vertex();

    // update
    heVertexArr[currHe.getIndex()] = nextVert.getIndex();
    vHalfedgeArr[nextVert.getIndex()] = currHe.getIndex();
    heOrientArr[currHe.getIndex()] = !heOrientArr[currHe.getIndex()];
    if (prevHe != Halfedge()) {
      heNextArr[currHe.getIndex()] = prevHe.getIndex();
    }

    // continue looping
    prevHe = currHe;
    currHe = nextHe;
  } while (currHe != firstHe);
  heNextArr[firstHe.getIndex()] = prevHe.getIndex();

  for (Halfedge he : f.adjacentHalfedges()) addToVertexLists(he);
  modificationTick++;
}